

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

void __thiscall
gimage::anon_unknown_6::TiffImage<unsigned_short>::~TiffImage(TiffImage<unsigned_short> *this)

{
  pointer puVar1;
  pointer puVar2;
  
  TIFFClose(this->tif);
  puVar1 = (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar2 = (this->row).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&this->rows);
  return;
}

Assistant:

~TiffImage()
    {
      TIFFClose(tif);
    }